

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

void LogAllAvailableFormats(snd_pcm_t *pcm)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t __n;
  undefined1 *__s;
  ulong uStack_40;
  undefined1 auStack_38 [8];
  
  uStack_40 = 0x10bd8d;
  __n = snd_pcm_hw_params_sizeof();
  lVar5 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_38 + lVar5;
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bdab;
  memset(__s,0,__n);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bdb6;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bdc3;
  snd_pcm_hw_params_test_format(pcm,__s,0);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 1;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bdd1;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 2;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bddf;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 3;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bded;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 4;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bdfb;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 5;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be09;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 6;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be17;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 7;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be25;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 8;
  uVar2 = *(ulong *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be37;
  snd_pcm_hw_params_test_format(pcm,__s,uVar2 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 9;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be45;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xe;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be53;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xf;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be61;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10;
  uVar3 = *(ulong *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be73;
  snd_pcm_hw_params_test_format(pcm,__s,uVar3 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be81;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x12;
  uVar4 = *(ulong *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10be93;
  snd_pcm_hw_params_test_format(pcm,__s,uVar4 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x13;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bea1;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x14;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10beaf;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x15;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bebd;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x16;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10becb;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x17;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bed9;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x18;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bee7;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1f;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bef5;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x20;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf03;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x21;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf11;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x22;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf1f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x23;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf2d;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x24;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf3b;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x25;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf49;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x26;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf57;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x27;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf65;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x28;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf73;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x29;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf81;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x2a;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf8f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x2b;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bf9d;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 2;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bfab;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 4;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bfb9;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 6;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bfc7;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bfd5;
  snd_pcm_hw_params_test_format(pcm,__s,uVar2 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 10;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bfe3;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xc;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bff1;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xe;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10bfff;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10c00d;
  snd_pcm_hw_params_test_format(pcm,__s,uVar3 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10c01b;
  snd_pcm_hw_params_test_format(pcm,__s,uVar4 & 0xffffffff);
  return;
}

Assistant:

static void LogAllAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    PA_DEBUG(( " --- Supported Formats ---\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S8\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U8\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MU_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MU_LAW\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_A_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_A_LAW\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IMA_ADPCM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IMA_ADPCM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MPEG ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MPEG\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_GSM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_GSM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_SPECIAL ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_SPECIAL\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S32\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U32\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME\n" ));

    PA_DEBUG(( " -------------------------\n" ));
}